

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,char (*params) [7])

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint uVar6;
  long lVar7;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  StringPtr *in_R9;
  HashBucket *_s944;
  uint *puVar8;
  uint *puVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  if ((ulong)(*(long *)(this_00 + 0x18) * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  uVar3 = hashCode<kj::StringPtr&>(in_R9);
  lVar4 = *(long *)(this_00 + 0x18);
  uVar6 = (int)lVar4 - 1U & uVar3;
  puVar8 = (uint *)0x0;
  aVar5 = extraout_RDX;
  do {
    puVar9 = (uint *)(*(long *)(this_00 + 0x10) + (ulong)uVar6 * 8);
    uVar1 = puVar9[1];
    if (uVar1 == 1) {
      if (puVar8 == (uint *)0x0) {
        puVar8 = puVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (puVar8 != (uint *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          puVar9 = puVar8;
        }
        *(ulong *)puVar9 = ((ulong)uVar3 | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
LAB_0016cc0d:
        MVar10.ptr.field_1.value = aVar5.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
      if (*puVar9 == uVar3) {
        bVar2 = String::operator==((String *)((ulong)(uVar1 - 2) * 0x20 + table.size_),in_R9);
        aVar5 = extraout_RDX_00;
        if (bVar2) {
          uVar3 = puVar9[1];
          *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar3 - 2);
          goto LAB_0016cc0d;
        }
        lVar4 = *(long *)(this_00 + 0x18);
      }
    }
    lVar7 = (ulong)uVar6 + 1;
    uVar6 = (uint)lVar7;
    if (lVar7 == lVar4) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }